

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O3

value_type *
winmd::reader::FixedArgSig::read_arg
          (value_type *__return_storage_ptr__,database *db,ParamSig *ctor_param,byte_view *data)

{
  uint *puVar1;
  uint8_t *puVar2;
  uint uVar3;
  ulong __n;
  vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> local_68;
  string local_50;
  
  if ((ctor_param->m_type).m_is_szarray == true) {
    local_68.super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    byte_view::check_available(data,4);
    puVar1 = (uint *)data->m_first;
    byte_view::check_available(data,4);
    puVar2 = data->m_first;
    data->m_first = puVar2 + 4;
    uVar3 = *puVar1;
    __n = (ulong)uVar3;
    if (__n != 0xffffffff) {
      if ((uint)(*(int *)&data->m_last - (int)(puVar2 + 4)) < uVar3) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Invalid blob array size","");
        impl::throw_invalid(&local_50);
      }
      std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>::reserve
                (&local_68,__n);
      while (uVar3 != 0) {
        std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>::
        emplace_back<winmd::reader::database_const&,winmd::reader::ParamSig_const&,winmd::reader::byte_view&>
                  ((vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>> *)
                   &local_68,db,ctor_param,data);
        uVar3 = (int)__n - 1;
        __n = (ulong)uVar3;
      }
    }
    *(pointer *)
     &(__return_storage_ptr__->
      super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
      ).super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      _M_u = local_68.
             super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             ).
             super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             ._M_u + 8) =
         local_68.
         super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>._M_impl
         .super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             ).
             super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             ._M_u + 0x10) =
         local_68.
         super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
    ).super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    _M_index = '\x01';
  }
  else {
    ElemSig::read_element((value_type *)__return_storage_ptr__,db,ctor_param,data);
    (__return_storage_ptr__->
    super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
    ).super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    _M_index = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

static value_type read_arg(database const& db, ParamSig const& ctor_param, byte_view& data)
        {
            auto const& type_sig = ctor_param.Type();
            if (type_sig.is_szarray())
            {
                std::vector<ElemSig> elems;
                auto const num_elements = read<uint32_t>(data);
                if (num_elements != 0xffffffff)
                {
                    if (num_elements > data.size())
                    {
                        impl::throw_invalid("Invalid blob array size");
                    }
                    elems.reserve(num_elements);
                    for (uint32_t i = 0; i < num_elements; ++i)
                    {
                        elems.emplace_back(db, ctor_param, data);
                    }
                }
                return elems;
            }
            else
            {
                return ElemSig{ db, ctor_param, data };
            }
        }